

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::
         ConstructMessageRecursive<duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                   (string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values,LogicalType *param,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2)

{
  string *in_RDI;
  string *in_R8;
  string *in_R9;
  LogicalType *in_stack_00000008;
  value_type *in_stack_fffffffffffffeb8;
  LogicalType *in_stack_fffffffffffffec0;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [88];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  
  LogicalType::LogicalType(in_stack_fffffffffffffec0,(LogicalType *)in_stack_fffffffffffffeb8);
  ExceptionFormatValue::CreateFormatValue<duckdb::LogicalType>(in_stack_00000008);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  push_back((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
            in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  ExceptionFormatValue::~ExceptionFormatValue((ExceptionFormatValue *)0x1575c4c);
  LogicalType::~LogicalType((LogicalType *)0x1575c59);
  ::std::__cxx11::string::string(local_b0,in_R8);
  ::std::__cxx11::string::string(local_d0,in_R9);
  ::std::__cxx11::string::string(local_f0,(string *)in_stack_00000008);
  ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  ::std::__cxx11::string::~string(local_f0);
  ::std::__cxx11::string::~string(local_d0);
  ::std::__cxx11::string::~string(local_b0);
  return in_RDI;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}